

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

Expression * __thiscall
rsg::ConstructorOp::createNextChild(ConstructorOp *this,GeneratorState *state)

{
  pointer *pppEVar1;
  pointer pVVar2;
  iterator __position;
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess CVar3;
  ExpressionSpec *pEVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Expression *child;
  Expression *local_30;
  long local_28;
  Scalar *pSStack_20;
  Scalar *local_18;
  
  local_30 = (Expression *)0x0;
  pVVar2 = (this->m_inputValueRanges).
           super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->m_inputValueRanges).
                super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pVVar2;
  iVar5 = (int)((ulong)((long)(this->m_inputExpressions).
                              super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_inputExpressions).
                             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar5 < (int)(uVar7 >> 7)) {
    lVar6 = ~(long)iVar5 * 0x80;
    pSStack_20 = *(Scalar **)((long)pVVar2 + lVar6 + 0x50 + uVar7);
    local_18 = *(Scalar **)((long)pVVar2 + lVar6 + 0x68 + uVar7);
    if (pSStack_20 == *(Scalar **)((long)pVVar2 + lVar6 + 0x58 + uVar7)) {
      pSStack_20 = (Scalar *)0x0;
    }
    if (local_18 == *(Scalar **)((long)pVVar2 + lVar6 + 0x70 + uVar7)) {
      local_18 = (Scalar *)0x0;
    }
    local_28 = (long)pVVar2 + lVar6 + uVar7;
    valueRange.m_min = pSStack_20;
    valueRange.m_type = (VariableType *)local_28;
    valueRange.m_max = local_18;
    pEVar4 = anon_unknown_0::chooseExpression
                       (state,(ExpressionSpec *)(anonymous_namespace)::s_expressionSpecs,0x1e,
                        valueRange);
    CVar3.m_min = pSStack_20;
    CVar3.m_type = (VariableType *)local_28;
    CVar3.m_max = local_18;
    local_30 = (*pEVar4->create)(state,CVar3);
    __position._M_current =
         (this->m_inputExpressions).
         super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_inputExpressions).
        super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::Expression*,std::allocator<rsg::Expression*>>::
      _M_realloc_insert<rsg::Expression*const&>
                ((vector<rsg::Expression*,std::allocator<rsg::Expression*>> *)
                 &this->m_inputExpressions,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppEVar1 = &(this->m_inputExpressions).
                  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  return local_30;
}

Assistant:

Expression* ConstructorOp::createNextChild (GeneratorState& state)
{
	int					numChildren	= (int)m_inputExpressions.size();
	Expression*			child		= DE_NULL;

	// \note Created in reverse order!
	if (numChildren < (int)m_inputValueRanges.size())
	{
		const ValueRange& inValueRange = m_inputValueRanges[m_inputValueRanges.size()-1-numChildren];
		child = Expression::createRandom(state, inValueRange);
		try
		{
			m_inputExpressions.push_back(child);
		}
		catch (const std::exception&)
		{
			delete child;
			throw;
		}
	}

	return child;
}